

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Gia_Man_t * Gia_ManInterOneInt(Gia_Man_t *pCof1,Gia_Man_t *pCof0,int Depth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Gia_Obj_t *pGVar4;
  long lVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *p_00;
  Gia_Man_t *pGVar7;
  ulong uVar8;
  int Addition;
  int Addition_00;
  Gia_Man_t *(*papGVar9) [2];
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int local_90;
  Gia_Man_t *pInter [2];
  Gia_Man_t *pGia [2];
  Gia_Man_t *pCof [2] [2];
  
  pCof[1][0] = (Gia_Man_t *)0x0;
  pCof[1][1] = (Gia_Man_t *)0x0;
  pCof[0][0] = (Gia_Man_t *)0x0;
  pCof[0][1] = (Gia_Man_t *)0x0;
  pGia[0] = pCof0;
  pGia[1] = pCof1;
  iVar1 = Gia_ManAndNum(pCof1);
  if (iVar1 != 0) {
    iVar1 = Gia_ManAndNum(pCof0);
    if (iVar1 != 0) {
      p = Vec_IntStart(pCof0->vCis->nSize);
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        pGVar7 = pGia[lVar5];
        for (iVar1 = 0; iVar1 < pGVar7->nObjs; iVar1 = iVar1 + 1) {
          pGVar4 = Gia_ManObj(pGVar7,iVar1);
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar10 = *(ulong *)pGVar4;
          uVar8 = uVar10 & 0x1fffffff;
          if (uVar8 != 0x1fffffff && -1 < (int)uVar10) {
            if (((undefined1  [12])pGVar4[-uVar8] & (undefined1  [12])0x9fffffff) ==
                (undefined1  [12])0x9fffffff) {
              iVar2 = Gia_ObjCioId(pGVar4 + -uVar8);
              Vec_IntAddToEntry(p,iVar2,Addition);
              uVar10 = *(ulong *)pGVar4;
            }
            uVar10 = (ulong)((uint)(uVar10 >> 0x20) & 0x1fffffff);
            if (((undefined1  [12])pGVar4[-uVar10] & (undefined1  [12])0x9fffffff) ==
                (undefined1  [12])0x9fffffff) {
              iVar2 = Gia_ObjCioId(pGVar4 + -uVar10);
              Vec_IntAddToEntry(p,iVar2,Addition_00);
            }
          }
        }
      }
      iVar2 = 0;
      iVar1 = p->nSize;
      if (p->nSize < 1) {
        iVar1 = 0;
      }
      local_90 = -1;
      iVar11 = 0;
      for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(p,iVar2);
        iVar12 = iVar11;
        if (iVar11 <= iVar3) {
          iVar12 = iVar3;
        }
        if (iVar11 < iVar3) {
          local_90 = iVar2;
        }
        iVar11 = iVar12;
      }
      Vec_IntFree(p);
      iVar1 = 8 - Depth;
      papGVar9 = pCof;
      for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
        pGVar7 = pGia[uVar10];
        for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
          pGVar6 = Gia_ManDupCofactorVar(pGVar7,local_90,(int)uVar8);
          p_00 = Acb_NtkEcoSynthesize(pGVar6);
          (*papGVar9)[uVar8] = p_00;
          Gia_ManStop(pGVar6);
          printf("%*sCof%d%d : ",iVar1,"",uVar10 & 0xffffffff,uVar8 & 0xffffffff);
          Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
        }
        papGVar9 = papGVar9 + 1;
      }
      uVar10 = 0;
      do {
        if (uVar10 == 2) {
          papGVar9 = pCof;
          for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
            for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
              Gia_ManStop((*papGVar9)[lVar13]);
            }
            papGVar9 = papGVar9 + 1;
          }
          pGVar7 = Gia_ManDupMux(local_90,pInter[1],pInter[0]);
          for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
            Gia_ManStop(pInter[lVar5]);
          }
          return pGVar7;
        }
        pGVar7 = pCof[1][uVar10];
        iVar2 = Gia_ManAndNum(pGVar7);
        if (iVar2 == 0) {
LAB_0032da24:
          pGVar7 = Gia_ManDup(pGVar7);
        }
        else {
          pGVar6 = pCof[0][uVar10];
          iVar2 = Gia_ManAndNum(pGVar6);
          if (iVar2 == 0) goto LAB_0032da24;
          if (Depth == 1) {
            pGVar7 = Gia_ManInterOne(pGVar7,pGVar6,1);
          }
          else {
            pGVar7 = Gia_ManInterOneInt(pGVar7,pGVar6,Depth + -1);
          }
        }
        printf("%*sInter%d : ",iVar1,"",uVar10 & 0xffffffff);
        Gia_ManPrintStats(pGVar7,(Gps_Par_t *)0x0);
        pGVar6 = Abc_GiaSynthesizeInter(pGVar7);
        pInter[uVar10] = pGVar6;
        Gia_ManStop(pGVar7);
        printf("%*sInter%d : ",iVar1,"",uVar10 & 0xffffffff);
        Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
        uVar10 = uVar10 + 1;
      } while( true );
    }
  }
  pGVar7 = Gia_ManDup(pCof1);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManInterOneInt( Gia_Man_t * pCof1, Gia_Man_t * pCof0, int Depth )
{
    extern Gia_Man_t * Gia_ManInterOne( Gia_Man_t * pNtkOn, Gia_Man_t * pNtkOff, int fVerbose );
    extern Gia_Man_t * Abc_GiaSynthesizeInter( Gia_Man_t * p );
    Gia_Man_t * pGia[2] = { pCof0, pCof1 };
    Gia_Man_t * pCof[2][2] = {{0}}, * pTemp;
    Gia_Man_t * pInter[2], * pFinal;
    Gia_Obj_t * pObj; 
    int i, n, m, Count, CountBest = 0, iVarBest = -1;
    // find PIs with the highest fanout
    Vec_Int_t * vFanCount;
    if ( Gia_ManAndNum(pCof1) == 0 || Gia_ManAndNum(pCof0) == 0 )
        return Gia_ManDup(pCof1);
    vFanCount = Vec_IntStart( Gia_ManCiNum(pCof0) );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManForEachAnd( pGia[n], pObj, i )
        {
            if ( Gia_ObjIsCi(Gia_ObjFanin0(pObj)) )
                Vec_IntAddToEntry( vFanCount, Gia_ObjCioId(Gia_ObjFanin0(pObj)), 1 );
            if ( Gia_ObjIsCi(Gia_ObjFanin1(pObj)) )
                Vec_IntAddToEntry( vFanCount, Gia_ObjCioId(Gia_ObjFanin1(pObj)), 1 );
        }
    }
    Vec_IntForEachEntry( vFanCount, Count, i )
        if ( CountBest < Count )
        {
            CountBest = Count;
            iVarBest = i;
        }
    Vec_IntFree( vFanCount );
    // Gia_Man_t * Gia_ManDupCofactorVar( Gia_Man_t * p, int iVar, int Value )
    for ( n = 0; n < 2; n++ )
    for ( m = 0; m < 2; m++ )
    {
        pCof[n][m] = Gia_ManDupCofactorVar( pGia[n], iVarBest, m );
        pCof[n][m] = Acb_NtkEcoSynthesize( pTemp = pCof[n][m] );
        Gia_ManStop( pTemp );
        printf( "%*sCof%d%d : ", 8-Depth, "", n, m );
        Gia_ManPrintStats( pCof[n][m], NULL );
    }
    for ( m = 0; m < 2; m++ )
    {
        if ( Gia_ManAndNum(pCof[1][m]) == 0 || Gia_ManAndNum(pCof[0][m]) == 0 )
            pInter[m] = Gia_ManDup( pCof[1][m] );
        else if ( Depth == 1 )
            pInter[m] = Gia_ManInterOne( pCof[1][m], pCof[0][m], 1 );
        else
            pInter[m] = Gia_ManInterOneInt( pCof[1][m], pCof[0][m], Depth-1 );
        printf( "%*sInter%d : ", 8-Depth, "", m );
        Gia_ManPrintStats( pInter[m], NULL );
        pInter[m] = Abc_GiaSynthesizeInter( pTemp = pInter[m] );
        Gia_ManStop( pTemp );
        printf( "%*sInter%d : ", 8-Depth, "", m );
        Gia_ManPrintStats( pInter[m], NULL );
    }
    for ( n = 0; n < 2; n++ )
    for ( m = 0; m < 2; m++ )
        Gia_ManStop( pCof[n][m] );
    pFinal = Gia_ManDupMux( iVarBest, pInter[1], pInter[0] );
    for ( m = 0; m < 2; m++ )
        Gia_ManStop( pInter[m] );
    return pFinal;
}